

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.cpp
# Opt level: O2

Coordsys * chrono::Force2Dcsys(Coordsys *__return_storage_ptr__,Coordsys *cs)

{
  (__return_storage_ptr__->pos).m_data[2] = 0.0;
  (__return_storage_ptr__->pos).m_data[0] = 0.0;
  (__return_storage_ptr__->pos).m_data[1] = 0.0;
  (__return_storage_ptr__->rot).m_data[0] = 1.0;
  (__return_storage_ptr__->rot).m_data[3] = 0.0;
  (__return_storage_ptr__->rot).m_data[1] = 0.0;
  (__return_storage_ptr__->rot).m_data[2] = 0.0;
  ChCoordsys<double>::operator=(__return_storage_ptr__,cs);
  (__return_storage_ptr__->pos).m_data[2] = 0.0;
  (__return_storage_ptr__->rot).m_data[1] = 0.0;
  (__return_storage_ptr__->rot).m_data[2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Coordsys Force2Dcsys(const Coordsys& cs) {
    Coordsys res;
    res = cs;
    res.pos.z() = 0;
    res.rot.e1() = 0;
    res.rot.e2() = 0;
    return (res);
}